

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_particles.cxx
# Opt level: O2

void __thiscall level_tools::reconstruct_particles(level_tools *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  xr_level_ps_static *pxVar10;
  pointer pppVar11;
  particle_data *ppVar12;
  xr_scene_particles *pxVar13;
  xr_particle_object *this_00;
  xr_custom_object_vec *this_01;
  pointer pppVar14;
  undefined1 auVar15 [16];
  xr_name_gen name;
  xr_particle_object *local_38;
  
  if (this->m_level->m_ps_static != (xr_level_ps_static *)0x0) {
    xray_re::msg("building %s","ps.part");
    pxVar10 = this->m_level->m_ps_static;
    pxVar13 = xray_re::xr_scene::particles(this->m_scene);
    this_01 = &(pxVar13->super_xr_scene_objects).m_objects;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_01,(long)(pxVar10->m_particles).
                             super__Vector_base<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pxVar10->m_particles).
                             super__Vector_base<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3);
    xray_re::xr_name_gen::init(&name,(EVP_PKEY_CTX *)0x1c986a);
    pppVar11 = (pxVar10->m_particles).
               super__Vector_base<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (pppVar14 = (pxVar10->m_particles).
                    super__Vector_base<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; pppVar14 != pppVar11;
        pppVar14 = pppVar14 + 1) {
      ppVar12 = *pppVar14;
      this_00 = (xr_particle_object *)operator_new(0x90);
      xray_re::xr_particle_object::xr_particle_object(this_00,this->m_scene);
      std::__cxx11::string::assign((char *)&(this_00->super_xr_custom_object).m_name);
      (this_00->super_xr_custom_object).m_position.field_0.field_0.x =
           (ppVar12->xform).field_0.field_0._41;
      (this_00->super_xr_custom_object).m_position.field_0.field_0.y =
           (ppVar12->xform).field_0.field_0._42;
      (this_00->super_xr_custom_object).m_position.field_0.field_0.z =
           (ppVar12->xform).field_0.field_0._43;
      xray_re::_matrix<float>::get_xyz
                (&ppVar12->xform,&(this_00->super_xr_custom_object).m_rotation);
      fVar1 = (ppVar12->xform).field_0.field_0._31;
      fVar2 = (ppVar12->xform).field_0.field_0._32;
      fVar3 = (ppVar12->xform).field_0.field_0._33;
      fVar4 = (ppVar12->xform).field_0.field_0._22;
      fVar5 = (ppVar12->xform).field_0.field_0._11;
      fVar6 = (ppVar12->xform).field_0.field_0._12;
      fVar7 = (ppVar12->xform).field_0.field_0._13;
      fVar8 = (ppVar12->xform).field_0.field_0._21;
      fVar9 = (ppVar12->xform).field_0.field_0._23;
      auVar15._0_4_ = fVar7 * fVar7 + fVar5 * fVar5 + fVar6 * fVar6;
      auVar15._4_4_ = fVar9 * fVar9 + fVar8 * fVar8 + fVar4 * fVar4;
      auVar15._8_8_ = 0;
      auVar15 = sqrtps(auVar15,auVar15);
      *(long *)&(this_00->super_xr_custom_object).m_scale.field_0 = auVar15._0_8_;
      (this_00->super_xr_custom_object).m_scale.field_0.field_0.z =
           SQRT(fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2);
      std::__cxx11::string::_M_assign((string *)&this_00->m_reference);
      local_38 = this_00;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>
                ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                 this_01,(xr_custom_object **)&local_38);
      xray_re::xr_name_gen::next(&name);
    }
    xray_re::xr_level::clear_ps_static(this->m_level);
    xray_re::xr_name_gen::~xr_name_gen(&name);
  }
  return;
}

Assistant:

void level_tools::reconstruct_particles()
{
	if (m_level->ps_static() == 0)
		return;
	msg("building %s", "ps.part");

	const particle_data_vec& particles = m_level->ps_static()->particles();

	xr_custom_object_vec& cobjects = m_scene->particles()->objects();
	cobjects.reserve(particles.size());

	xr_name_gen name("ps");
	for (particle_data_vec_cit it = particles.begin(), end = particles.end(); it != end; ++it, name.next()) {
		particle_data* ps = *it;
		xr_particle_object* new_ps = new xr_particle_object(*m_scene);
		new_ps->co_name() = name.get();
		new_ps->co_position().set(ps->xform.c);
		ps->xform.get_xyz(new_ps->co_rotation());
		// FIXME: this is not correct
		new_ps->co_scale().set(ps->xform.i.magnitude(),
				ps->xform.j.magnitude(), ps->xform.k.magnitude());
		new_ps->reference() = ps->reference;
		cobjects.push_back(new_ps);
	}
	m_level->clear_ps_static();
}